

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_traceback(lua_State *L)

{
  lua_State *L_00;
  lua_State *in_RDI;
  char *msg;
  lua_State *L1;
  int arg;
  int in_stack_0000004c;
  char *in_stack_00000050;
  lua_State *in_stack_00000058;
  lua_State *in_stack_00000060;
  size_t *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  int idx;
  lua_State *in_stack_ffffffffffffffe0;
  int local_c;
  lua_State *local_8;
  
  idx = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  local_8 = in_RDI;
  getthread(in_RDI,&local_c);
  L_00 = (lua_State *)lua_tolstring(in_stack_ffffffffffffffe0,idx,in_stack_ffffffffffffffd0);
  if ((L_00 == (lua_State *)0x0) && (local_8->base + local_c < local_8->top)) {
    local_8->top = local_8->base + (long)local_c + 1;
  }
  else {
    lj_lib_optint(L_00,(int)((ulong)L_00 >> 0x20),(int32_t)L_00);
    luaL_traceback(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_0000004c);
  }
  return 1;
}

Assistant:

LJLIB_CF(debug_traceback)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  const char *msg = lua_tostring(L, arg+1);
  if (msg == NULL && L->top > L->base+arg)
    L->top = L->base+arg+1;
  else
    luaL_traceback(L, L1, msg, lj_lib_optint(L, arg+2, (L == L1)));
  return 1;
}